

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::MultiNodeChain<QCss::StyleRule>::free
          (MultiNodeChain<QCss::StyleRule> *this,void *__ptr)

{
  MultiNodeChain<QCss::StyleRule> *pMVar1;
  qsizetype nEntries;
  
  do {
    pMVar1 = this->next;
    QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&(this->value).declarations.d);
    QArrayDataPointer<QCss::Selector>::~QArrayDataPointer((QArrayDataPointer<QCss::Selector> *)this)
    ;
    operator_delete(this,0x40);
    this = pMVar1;
  } while (pMVar1 != (MultiNodeChain<QCss::StyleRule> *)0x0);
  return;
}

Assistant:

qsizetype free() noexcept(std::is_nothrow_destructible_v<T>)
    {
        qsizetype nEntries = 0;
        MultiNodeChain *e = this;
        while (e) {
            MultiNodeChain *n = e->next;
            ++nEntries;
            delete e;
            e = n;
        }
        return  nEntries;
    }